

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O2

results_type * __thiscall
webfront::http::std::experimental::net::v1::ip::basic_resolver<std::experimental::net::v1::ip::tcp>
::resolve(results_type *__return_storage_ptr__,
         basic_resolver<std::experimental::net::v1::ip::tcp> *this,string_view host,
         string_view service,flags resolve_flags)

{
  error_code ec;
  basic_resolver_query<std::experimental::net::v1::ip::tcp> q;
  allocator<char> local_fa;
  allocator<char> local_f9;
  error_code local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  string local_d8;
  string local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_resolver_query<std::experimental::net::v1::ip::tcp> local_88;
  
  local_e8._M_str = service._M_str;
  local_e8._M_len = service._M_len;
  local_98._M_str = host._M_str;
  local_98._M_len = host._M_len;
  local_f8._M_value = 0;
  local_f8._M_cat = (error_category *)::std::_V2::system_category();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_b8,&local_98,&local_f9);
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_d8,&local_e8,&local_fa);
  basic_resolver_query<std::experimental::net::v1::ip::tcp>::basic_resolver_query
            (&local_88,&local_b8,&local_d8,resolve_flags);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>::resolve
            (__return_storage_ptr__,
             (this->
             super_basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
             ).service_,
             &(this->
              super_basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
              ).implementation_,&local_88,&local_f8);
  v1::detail::throw_error(&local_f8,"resolve");
  basic_resolver_query<std::experimental::net::v1::ip::tcp>::~basic_resolver_query(&local_88);
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(NET_TS_STRING_VIEW_PARAM host,
      NET_TS_STRING_VIEW_PARAM service, resolver_base::flags resolve_flags)
  {
    std::error_code ec;
    basic_resolver_query<protocol_type> q(static_cast<std::string>(host),
        static_cast<std::string>(service), resolve_flags);
    results_type r = this->get_service().resolve(
        this->get_implementation(), q, ec);
    std::experimental::net::v1::detail::throw_error(ec, "resolve");
    return r;
  }